

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void DivisionHelper<unsigned_short,signed_char,1>::
     DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (unsigned_short *t,char *u,unsigned_short *result)

{
  char t_00;
  ushort uVar1;
  uint32_t uVar2;
  
  t_00 = *u;
  if (t_00 == '\0') {
    safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnDivZero();
  }
  if (*t != 0) {
    if ('\0' < t_00) {
      uVar1 = *t / (ushort)(short)t_00;
      goto LAB_00116713;
    }
    uVar2 = AbsValueHelper<signed_char,_0>::Abs(t_00);
    if (uVar2 <= *t) {
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
    }
  }
  uVar1 = 0;
LAB_00116713:
  *result = uVar1;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void DivideThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {

        if( u == 0 )
            E::SafeIntOnDivZero();

        if( t == 0 )
        {
            result = 0;
            return;
        }

        if( u > 0 )
        {
            result = (T)( t/u );
            return;
        }

        // it is always an error to try and divide an unsigned number by a negative signed number
        // unless u is bigger than t
        if( AbsValueHelper< U, GetAbsMethod< U >::method >::Abs( u ) > t )
        {
            result = 0;
            return;
        }

        E::SafeIntOnOverflow();
    }